

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

Result * cfWriteconfig(Result *__return_storage_ptr__,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      params)

{
  undefined1 local_270 [8];
  ofstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [14];
  ios_base local_178 [264];
  undefined1 local_70 [8];
  size_type __dnew;
  string local_60;
  undefined1 local_40 [8];
  Writer writer;
  Node node;
  
  Jzon::object();
  local_260[0]._M_allocated_capacity._0_4_ = 0x74646977;
  local_260[0]._M_allocated_capacity._4_2_ = 0x68;
  _file = 5;
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,(int)size.x);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x67696568;
  local_260[0]._M_allocated_capacity._4_2_ = 0x7468;
  _file = 6;
  local_260[0]._M_local_buf[6] = '\0';
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,(int)size.y);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x707062;
  _file = 3;
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,bitsPerPixel);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x6c6c7566;
  local_260[0]._M_allocated_capacity._4_2_ = 0x6373;
  local_260[0]._M_local_buf[6] = 'r';
  local_260[0]._M_local_buf[7] = 'e';
  local_260[0]._8_2_ = 0x6e65;
  _file = 10;
  local_260[0]._M_local_buf[10] = '\0';
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,enableFullscreen);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x6f747561;
  local_260[0]._M_allocated_capacity._4_2_ = 0x6572;
  local_260[0]._M_local_buf[6] = 's';
  local_260[0]._M_local_buf[7] = 'o';
  local_260[0]._8_2_ = 0x756c;
  local_260[0]._M_local_buf[10] = 't';
  local_260[0]._M_local_buf[0xb] = 'i';
  local_260[0]._M_local_buf[0xc] = 'o';
  local_260[0]._M_local_buf[0xd] = 'n';
  _file = 0xe;
  local_260[0]._M_local_buf[0xe] = '\0';
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,autoResolution);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x6e797376;
  local_260[0]._M_allocated_capacity._4_2_ = 99;
  _file = 5;
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,enableVSync);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x64726f62;
  local_260[0]._M_allocated_capacity._4_2_ = 0x7265;
  local_260[0]._M_local_buf[6] = 'l';
  local_260[0]._M_local_buf[7] = 'e';
  local_260[0]._8_2_ = 0x7373;
  _file = 10;
  local_260[0]._M_local_buf[10] = '\0';
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,enableBorderless);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x69736572;
  local_260[0]._M_allocated_capacity._4_2_ = 0x657a;
  local_260[0]._M_local_buf[6] = 'a';
  local_260[0]._M_local_buf[7] = 'b';
  local_260[0]._8_2_ = 0x656c;
  _file = 10;
  local_260[0]._M_local_buf[10] = '\0';
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,enableResizable);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  local_260[0]._M_allocated_capacity._0_4_ = 0x67726174;
  local_260[0]._M_allocated_capacity._4_2_ = 0x7465;
  local_260[0]._M_local_buf[6] = 'e';
  local_260[0]._M_local_buf[7] = 'x';
  local_260[0]._8_2_ = 0x6563;
  local_260[0]._M_local_buf[10] = 's';
  local_260[0]._M_local_buf[0xb] = 's';
  _file = 0xc;
  local_260[0]._M_local_buf[0xc] = '\0';
  local_270 = (undefined1  [8])local_260;
  Jzon::Node::Node((Node *)local_40,targetExcess);
  Jzon::Node::add((Node *)&writer.spacing,(string *)local_270,(Node *)local_40);
  Jzon::Node::~Node((Node *)local_40);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  Jzon::Writer::Writer((Writer *)local_40,(Format *)&Jzon::NoFormat);
  std::ofstream::ofstream(local_270,"data/config.json",_S_out);
  Jzon::Writer::writeStream((Writer *)local_40,(Node *)&writer.spacing,(ostream *)local_270);
  local_70 = (undefined1  [8])0x16;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)local_70);
  local_60.field_2._M_allocated_capacity = (size_type)local_70;
  builtin_strncpy(local_60._M_dataplus._M_p,"wrote data/config.json",0x16);
  local_60._M_string_length = (size_type)local_70;
  local_60._M_dataplus._M_p[(long)local_70] = '\0';
  nite::Color::Color((Color *)local_70,1.0,1.0,1.0,1.0);
  nite::Console::Result::Result(__return_storage_ptr__,&local_60,(Color *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_270 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_270 + *(long *)(_VTT + -0x18)) = _getcwd;
  std::filebuf::~filebuf((filebuf *)&file);
  std::ios_base::~ios_base(local_178);
  Jzon::Writer::~Writer((Writer *)local_40);
  Jzon::Node::~Node((Node *)&writer.spacing);
  return __return_storage_ptr__;
}

Assistant:

static nite::Console::Result cfWriteconfig(Vector<String> params){
	return writeConfigFile();
}